

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_argv.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2897ce::ArgParser::ArgParser
          (ArgParser *this,QPDFArgParser *ap,shared_ptr<QPDFJob::Config> *c_main)

{
  shared_ptr<QPDFJob::Config> *c_main_local;
  QPDFArgParser *ap_local;
  ArgParser *this_local;
  
  QPDFArgParser::QPDFArgParser(&this->ap,ap);
  std::shared_ptr<QPDFJob::Config>::shared_ptr(&this->c_main,c_main);
  std::shared_ptr<QPDFJob::CopyAttConfig>::shared_ptr(&this->c_copy_att);
  std::shared_ptr<QPDFJob::AttConfig>::shared_ptr(&this->c_att);
  std::shared_ptr<QPDFJob::PagesConfig>::shared_ptr(&this->c_pages);
  std::shared_ptr<QPDFJob::UOConfig>::shared_ptr(&this->c_uo);
  std::shared_ptr<QPDFJob::EncConfig>::shared_ptr(&this->c_enc);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->accumulated_args);
  std::__cxx11::string::string((string *)&this->user_password);
  std::__cxx11::string::string((string *)&this->owner_password);
  this->called_pages_file = false;
  this->called_pages_range = false;
  this->used_enc_password_args = false;
  this->gave_input = false;
  this->gave_output = false;
  initOptionTables(this);
  return;
}

Assistant:

ArgParser::ArgParser(QPDFArgParser& ap, std::shared_ptr<QPDFJob::Config> c_main) :
    ap(ap),
    c_main(c_main)
{
    initOptionTables();
}